

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O0

char * kwssys::SystemTools::FindLastString(char *str1,char *str2)

{
  int iVar1;
  size_t sVar2;
  size_t __n;
  char *in_RSI;
  char *in_RDI;
  bool bVar3;
  char *ptr;
  size_t len2;
  size_t len1;
  char *local_30;
  
  if ((in_RDI != (char *)0x0) && (in_RSI != (char *)0x0)) {
    sVar2 = strlen(in_RDI);
    __n = strlen(in_RSI);
    if (__n <= sVar2) {
      local_30 = in_RDI + (sVar2 - __n);
      do {
        iVar1 = strncmp(local_30,in_RSI,__n);
        if (iVar1 == 0) {
          return local_30;
        }
        bVar3 = local_30 != in_RDI;
        local_30 = local_30 + -1;
      } while (bVar3);
    }
  }
  return (char *)0x0;
}

Assistant:

const char* SystemTools::FindLastString(const char* str1, const char* str2)
{
  if (!str1 || !str2) {
    return nullptr;
  }

  size_t len1 = strlen(str1), len2 = strlen(str2);
  if (len1 >= len2) {
    const char* ptr = str1 + len1 - len2;
    do {
      if (!strncmp(ptr, str2, len2)) {
        return ptr;
      }
    } while (ptr-- != str1);
  }

  return nullptr;
}